

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

void cppwinrt::get_interfaces_impl
               (writer *w,get_interfaces_t *result,bool defaulted,bool overridable,bool base,
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *generic_param_stack,
               pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *children)

{
  uint32_t uVar1;
  table_base *ptVar2;
  undefined8 uVar3;
  vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
  *this;
  pointer pTVar4;
  bool bVar5;
  bool bVar6;
  interface_info *piVar7;
  pointer args;
  coded_index<winmd::reader::TypeDefOrRef> cVar8;
  TypeDef TVar9;
  generic_param_guard guard;
  undefined1 local_160 [32];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vStack_140;
  InterfaceImpl __begin1;
  coded_index<winmd::reader::TypeDefOrRef> local_110;
  vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
  *local_100;
  string_view local_f8;
  GenericTypeInstSig signature;
  TypeSpecSig type_signature;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  
  __begin1.super_row_base<winmd::reader::InterfaceImpl>.m_table =
       (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  uVar3._0_4_ = (children->first).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  uVar3._4_4_ = *(undefined4 *)
                 &(children->first).super_row_base<winmd::reader::InterfaceImpl>.field_0xc;
  ptVar2 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_table;
  uVar1 = (children->second).super_row_base<winmd::reader::InterfaceImpl>.m_index;
  __begin1.super_row_base<winmd::reader::InterfaceImpl>._8_8_ = uVar3;
  local_100 = (vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
               *)result;
  while( true ) {
    if ((__begin1.super_row_base<winmd::reader::InterfaceImpl>.m_table == ptVar2) &&
       ((uint32_t)uVar3 == uVar1)) break;
    local_160._0_8_ = (table_base *)0x0;
    local_160._8_4_ = 0;
    local_160[0x14] = false;
    local_160[0x15] = false;
    local_160[0x10] = false;
    local_160[0x11] = false;
    local_160[0x12] = false;
    local_160[0x13] = false;
    vStack_140.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_140.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_160._24_4_ = 0;
    local_160._28_4_ = 0;
    vStack_140.
    super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    cVar8 = winmd::reader::InterfaceImpl::Interface(&__begin1);
    local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table =
         cVar8.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_table;
    local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_value =
         cVar8.super_typed_index<winmd::reader::TypeDefOrRef>.
         super_index_base<winmd::reader::TypeDefOrRef>.m_value;
    type_signature.m_type.m_class_or_value = Void;
    type_signature.m_type._1_7_ = 0;
    type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)0x1a379c;
    writer_base<cppwinrt::writer>::
    write_temp<winmd::reader::coded_index<winmd::reader::TypeDefOrRef>>
              (&name,&w->super_writer_base<cppwinrt::writer>,(string_view *)&type_signature.m_type,
               &local_110);
    type_signature.m_type.m_class_or_value = FnPtr;
    type_signature.m_type._1_7_ = 0;
    type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a602;
    signature.m_class_or_value = ByRef;
    signature._1_7_ = 0;
    signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a61c;
    bVar5 = has_attribute<winmd::reader::InterfaceImpl>
                      (&__begin1,(string_view *)&type_signature.m_type,(string_view *)&signature);
    bVar6 = bVar5;
    if (defaulted) {
      bVar6 = true;
    }
    if (base) {
      bVar6 = false;
    }
    local_160[0x11] = bVar6;
    local_160[0x10] = bVar5;
    type_signature.m_type._0_8_ = name._M_string_length;
    type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
    super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)name._M_dataplus._M_p;
    piVar7 = find((get_interfaces_t *)local_100,(string_view *)&type_signature.m_type);
    if ((piVar7 == (interface_info *)0x0) ||
       ((piVar7->defaulted == false && ((bool)local_160[0x11] != false)))) {
      bVar6 = true;
      if (!overridable) {
        type_signature.m_type.m_class_or_value = FnPtr;
        type_signature.m_type._1_7_ = 0;
        type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a602;
        signature.m_class_or_value = Array;
        signature._1_7_ = 0;
        signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a636;
        bVar6 = has_attribute<winmd::reader::InterfaceImpl>
                          (&__begin1,(string_view *)&type_signature.m_type,(string_view *)&signature
                          );
      }
      local_160[0x12] = bVar6;
      local_160[0x13] = base;
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator=(&vStack_140,generic_param_stack);
      guard.owner = (writer *)0x0;
      switch(local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
             super_index_base<winmd::reader::TypeDefOrRef>.m_value & 3) {
      case 0:
        local_160._0_8_ =
             &(local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->TypeDef;
        local_160._8_4_ =
             (local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
              super_index_base<winmd::reader::TypeDefOrRef>.m_value >> 2) - 1;
        break;
      case 1:
        type_signature.m_type._0_8_ =
             (local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
              super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
        type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_table =
             (table_base *)
             CONCAT44(type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
                      super_index_base<winmd::reader::TypeDefOrRef>.m_table._4_4_,
                      (local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
                       super_index_base<winmd::reader::TypeDefOrRef>.m_value >> 2) - 1);
        TVar9 = winmd::reader::find_required((TypeRef *)&type_signature.m_type);
        local_160._0_8_ = TVar9.super_row_base<winmd::reader::TypeDef>.m_table;
        local_160._8_4_ = TVar9.super_row_base<winmd::reader::TypeDef>.m_index;
        writer::add_depends(w,(TypeDef *)local_160);
        break;
      case 2:
        signature._0_8_ =
             &(local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
               super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database->TypeSpec;
        signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
        super_index_base<winmd::reader::TypeDefOrRef>.m_table =
             (table_base *)
             CONCAT44(signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
                      super_index_base<winmd::reader::TypeDefOrRef>.m_table._4_4_,
                      (local_110.super_typed_index<winmd::reader::TypeDefOrRef>.
                       super_index_base<winmd::reader::TypeDefOrRef>.m_value >> 2) - 1);
        winmd::reader::TypeSpec::Signature
                  ((TypeSpecSig *)&type_signature.m_type,(TypeSpec *)&signature);
        pTVar4 = type_signature.m_type.m_generic_args.
                 super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        names.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        for (args = type_signature.m_type.m_generic_args.
                    super__Vector_base<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>
                    ._M_impl.super__Vector_impl_data._M_start; args != pTVar4; args = args + 1) {
          local_f8._M_len = 1;
          local_f8._M_str = "%";
          writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeSig>
                    ((string *)&signature,&w->super_writer_base<cppwinrt::writer>,&local_f8,args);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&names,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&signature
                    );
          std::__cxx11::string::~string((string *)&signature);
        }
        std::
        vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
        ::emplace_back<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((vector<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::allocator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    *)&vStack_140,&names);
        writer::push_generic_params((writer *)&signature,(GenericTypeInstSig *)w);
        guard.owner = (writer *)signature._0_8_;
        signature.m_class_or_value = End;
        signature._1_7_ = 0;
        writer::generic_param_guard::~generic_param_guard((generic_param_guard *)&signature);
        winmd::reader::GenericTypeInstSig::GenericTypeInstSig(&signature,&type_signature.m_type);
        local_f8._M_len =
             (size_t)signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
                     super_index_base<winmd::reader::TypeDefOrRef>.m_table;
        local_f8._M_str =
             (char *)CONCAT44(local_f8._M_str._4_4_,
                              signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
                              super_index_base<winmd::reader::TypeDefOrRef>.m_value);
        TVar9 = winmd::reader::find_required((coded_index<winmd::reader::TypeDefOrRef> *)&local_f8);
        local_160._0_8_ = TVar9.super_row_base<winmd::reader::TypeDef>.m_table;
        local_160._8_4_ = TVar9.super_row_base<winmd::reader::TypeDef>.m_index;
        std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                  (&signature.m_generic_args);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&names);
        std::vector<winmd::reader::TypeSig,_std::allocator<winmd::reader::TypeSig>_>::~vector
                  (&type_signature.m_type.m_generic_args);
      }
      type_signature.m_type.m_class_or_value = FnPtr;
      type_signature.m_type._1_7_ = 0;
      type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a602;
      signature.m_class_or_value = Array;
      signature._1_7_ = 0;
      signature.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)anon_var_dwarf_9a650;
      bVar6 = has_attribute<winmd::reader::TypeDef>
                        ((TypeDef *)local_160,(string_view *)&type_signature.m_type,
                         (string_view *)&signature);
      local_160[0x14] = bVar6;
      bVar6 = (bool)local_160[0x11];
      bVar5 = (bool)local_160[0x12];
      winmd::reader::TypeDef::InterfaceImpl
                ((pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)
                 &type_signature.m_type,(TypeDef *)local_160);
      this = local_100;
      get_interfaces_impl(w,(get_interfaces_t *)local_100,bVar6,bVar5,base,&vStack_140,
                          (pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)
                          &type_signature.m_type);
      type_signature.m_type._0_8_ = name._M_string_length;
      type_signature.m_type.m_type.super_typed_index<winmd::reader::TypeDefOrRef>.
      super_index_base<winmd::reader::TypeDefOrRef>.m_table = (table_base *)name._M_dataplus._M_p;
      piVar7 = find((get_interfaces_t *)this,(string_view *)&type_signature.m_type);
      if (piVar7 == (interface_info *)0x0) {
        std::
        vector<std::pair<std::__cxx11::string,cppwinrt::interface_info>,std::allocator<std::pair<std::__cxx11::string,cppwinrt::interface_info>>>
        ::
        emplace_back<std::basic_string_view<char,std::char_traits<char>>const&,cppwinrt::interface_info>
                  (this,(basic_string_view<char,_std::char_traits<char>_> *)&type_signature.m_type,
                   (interface_info *)local_160);
      }
      else {
        interface_info::operator=(piVar7,(interface_info *)local_160);
      }
      writer::generic_param_guard::~generic_param_guard(&guard);
    }
    std::__cxx11::string::~string((string *)&name);
    std::
    vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector(&vStack_140);
    uVar3._0_4_ = __begin1.super_row_base<winmd::reader::InterfaceImpl>.m_index + 1;
    __begin1.super_row_base<winmd::reader::InterfaceImpl>.m_index = (uint32_t)uVar3;
  }
  return;
}

Assistant:

static void get_interfaces_impl(writer& w, get_interfaces_t& result, bool defaulted, bool overridable, bool base, std::vector<std::vector<std::string>> const& generic_param_stack, std::pair<InterfaceImpl, InterfaceImpl>&& children)
    {
        for (auto&& impl : children)
        {
            interface_info info;
            auto type = impl.Interface();
            auto name = w.write_temp("%", type);
            info.is_default = has_attribute(impl, "Windows.Foundation.Metadata", "DefaultAttribute");
            info.defaulted = !base && (defaulted || info.is_default);

            {
                // This is for correctness rather than an optimization (but helps performance as well).
                // If the interface was not previously inserted, carry on and recursively insert it.
                // If a previous insertion was defaulted we're done as it is correctly captured.
                // If a newly discovered instance of a previous insertion is not defaulted, we're also done.
                // If it was previously captured as non-defaulted but now found as defaulted, we carry on and
                // rediscover it as we need it to be defaulted recursively.

                if (auto found = find(result, name))
                {
                    if (found->defaulted || !info.defaulted)
                    {
                        continue;
                    }
                }
            }

            info.overridable = overridable || has_attribute(impl, "Windows.Foundation.Metadata", "OverridableAttribute");
            info.base = base;
            info.generic_param_stack = generic_param_stack;
            writer::generic_param_guard guard;

            switch (type.type())
            {
                case TypeDefOrRef::TypeDef:
                {
                    info.type = type.TypeDef();
                    break;
                }
                case TypeDefOrRef::TypeRef:
                {
                    info.type = find_required(type.TypeRef());
                    w.add_depends(info.type);
                    break;
                }
                case TypeDefOrRef::TypeSpec:
                {
                    auto type_signature = type.TypeSpec().Signature();

                    std::vector<std::string> names;

                    for (auto&& arg : type_signature.GenericTypeInst().GenericArgs())
                    {
                        names.push_back(w.write_temp("%", arg));
                    }

                    info.generic_param_stack.push_back(std::move(names));

                    guard = w.push_generic_params(type_signature.GenericTypeInst());
                    auto signature = type_signature.GenericTypeInst();
                    info.type = find_required(signature.GenericType());

                    break;
                }
            }

            info.exclusive = has_attribute(info.type, "Windows.Foundation.Metadata", "ExclusiveToAttribute");
            get_interfaces_impl(w, result, info.defaulted, info.overridable, base, info.generic_param_stack, info.type.InterfaceImpl());
            insert_or_assign(result, name, std::move(info));
        }
    }